

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlCharEncOutput(xmlOutputBufferPtr output,int init)

{
  xmlBufPtr buf;
  xmlBufPtr buf_00;
  xmlCharEncodingHandler *pxVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  xmlChar *pxVar6;
  xmlChar *in;
  int iVar7;
  ulong len_00;
  int c_out;
  int c_in;
  int len;
  int local_4c;
  xmlChar charref [20];
  
  if ((((output == (xmlOutputBufferPtr)0x0) || (output->encoder == (xmlCharEncodingHandlerPtr)0x0))
      || (buf = output->buffer, buf == (xmlBufPtr)0x0)) ||
     (buf_00 = output->conv, buf_00 == (xmlBufPtr)0x0)) {
    return -1;
  }
  iVar7 = 0;
  local_4c = init;
LAB_0012ce48:
  do {
    sVar4 = xmlBufAvail(buf_00);
    if (local_4c != 0) {
      c_in = 0;
      c_out = (int)sVar4;
      pxVar1 = output->encoder;
      pxVar6 = xmlBufEnd(buf_00);
      xmlEncOutputChunk(pxVar1,pxVar6,&c_out,(uchar *)0x0,&c_in);
      xmlBufAddLen(buf_00,(long)c_out);
      return c_out;
    }
    sVar5 = xmlBufUse(buf);
    if (0xffff < sVar5) {
      sVar5 = 0x10000;
    }
    len_00 = (ulong)(uint)((int)sVar5 * 4);
    if (sVar4 <= len_00) {
      iVar2 = xmlBufGrow(buf_00,len_00);
      if (iVar2 < 0) {
        iVar2 = -4;
        goto LAB_0012d00a;
      }
      sVar4 = xmlBufAvail(buf_00);
    }
    if (0x3ffff < sVar4) {
      sVar4 = 0x40000;
    }
    c_out = (int)sVar4;
    pxVar1 = output->encoder;
    c_in = (int)sVar5;
    pxVar6 = xmlBufEnd(buf_00);
    in = xmlBufContent(buf);
    iVar2 = xmlEncOutputChunk(pxVar1,pxVar6,&c_out,in,&c_in);
    xmlBufShrink(buf,(long)c_in);
    xmlBufAddLen(buf_00,(long)c_out);
    iVar7 = iVar7 + c_out;
  } while (iVar2 == -3);
  if (iVar2 == -2) {
    sVar4 = xmlBufUse(buf);
    len = (int)sVar4;
    pxVar6 = xmlBufContent(buf);
    iVar2 = xmlGetUTF8Char(pxVar6,&len);
    if (iVar2 < 1) {
      iVar2 = -2;
    }
    else {
      iVar2 = xmlSerializeDecCharRef((char *)charref,iVar2);
      xmlBufGrow(buf_00,(long)(iVar2 * 4));
      sVar4 = xmlBufAvail(buf_00);
      c_out = (int)sVar4;
      pxVar1 = output->encoder;
      c_in = iVar2;
      pxVar6 = xmlBufEnd(buf_00);
      iVar3 = xmlEncOutputChunk(pxVar1,pxVar6,&c_out,charref,&c_in);
      if ((-1 < iVar3) && (c_in == iVar2)) {
        xmlBufShrink(buf,(long)len);
        xmlBufAddLen(buf_00,(long)c_out);
        iVar7 = iVar7 + c_out;
        goto LAB_0012ce48;
      }
      iVar2 = -1;
    }
  }
LAB_0012d00a:
  if ((0 < iVar7 || iVar2 == 0) && (iVar2 != -4)) {
    return iVar7;
  }
  if (output->error == 0) {
    iVar7 = 1;
    if (iVar2 == -2) {
      iVar7 = 0x51;
    }
    iVar3 = 2;
    if (iVar2 != -4) {
      iVar3 = iVar7;
    }
    output->error = iVar3;
    return iVar2;
  }
  return iVar2;
}

Assistant:

int
xmlCharEncOutput(xmlOutputBufferPtr output, int init)
{
    int ret;
    size_t written;
    int writtentot = 0;
    size_t toconv;
    int c_in;
    int c_out;
    xmlBufPtr in;
    xmlBufPtr out;

    if ((output == NULL) || (output->encoder == NULL) ||
        (output->buffer == NULL) || (output->conv == NULL))
        return(XML_ENC_ERR_INTERNAL);
    out = output->conv;
    in = output->buffer;

retry:

    written = xmlBufAvail(out);

    /*
     * First specific handling of the initialization call
     */
    if (init) {
        c_in = 0;
        c_out = written;
        /* TODO: Check return value. */
        xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                          NULL, &c_in);
        xmlBufAddLen(out, c_out);
        return(c_out);
    }

    /*
     * Conversion itself.
     */
    toconv = xmlBufUse(in);
    if (toconv > 64 * 1024)
        toconv = 64 * 1024;
    if (toconv * 4 >= written) {
        if (xmlBufGrow(out, toconv * 4) < 0) {
            ret = XML_ENC_ERR_MEMORY;
            goto error;
        }
        written = xmlBufAvail(out);
    }
    if (written > 256 * 1024)
        written = 256 * 1024;

    c_in = toconv;
    c_out = written;
    ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                            xmlBufContent(in), &c_in);
    xmlBufShrink(in, c_in);
    xmlBufAddLen(out, c_out);
    writtentot += c_out;

    if (ret == XML_ENC_ERR_SPACE)
        goto retry;

    /*
     * Attempt to handle error cases
     */
    if (ret == XML_ENC_ERR_INPUT) {
        xmlChar charref[20];
        int len = xmlBufUse(in);
        xmlChar *content = xmlBufContent(in);
        int cur, charrefLen;

        cur = xmlGetUTF8Char(content, &len);
        if (cur <= 0)
            goto error;

        /*
         * Removes the UTF8 sequence, and replace it by a charref
         * and continue the transcoding phase, hoping the error
         * did not mangle the encoder state.
         */
        charrefLen = xmlSerializeDecCharRef((char *) charref, cur);
        xmlBufGrow(out, charrefLen * 4);
        c_out = xmlBufAvail(out);
        c_in = charrefLen;
        ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                                charref, &c_in);
        if ((ret < 0) || (c_in != charrefLen)) {
            ret = XML_ENC_ERR_INTERNAL;
            goto error;
        }

        xmlBufShrink(in, len);
        xmlBufAddLen(out, c_out);
        writtentot += c_out;
        goto retry;
    }

error:
    if (((writtentot <= 0) && (ret != 0)) ||
        (ret == XML_ENC_ERR_MEMORY)) {
        if (output->error == 0)
            output->error = xmlEncConvertError(ret);
        return(ret);
    }

    return(writtentot);
}